

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

void __thiscall
Kraken::KClient::KClient(KClient *this,string *key,string *secret,string *url,string *version)

{
  string *version_local;
  string *url_local;
  string *secret_local;
  string *key_local;
  KClient *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  std::__cxx11::string::string((string *)&this->secret_,(string *)secret);
  std::__cxx11::string::string((string *)&this->url_,(string *)url);
  std::__cxx11::string::string((string *)&this->version_,(string *)version);
  init(this,(EVP_PKEY_CTX *)version);
  return;
}

Assistant:

KClient::KClient(const std::string& key, const std::string& secret, 
	   const std::string& url, const std::string& version)
   :key_(key), secret_(secret), url_(url), version_(version) 
{ 
   init(); 
}